

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_impl.h
# Opt level: O0

atoms * __thiscall
c74::min::object_base::try_call
          (atoms *__return_storage_ptr__,object_base *this,string *name,atoms *args)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_true>
  local_30;
  iterator found_message;
  atoms *args_local;
  string *name_local;
  object_base *this_local;
  
  found_message.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_true>
               )args;
  local_30._M_cur =
       (__node_type *)
       Catch::clara::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>_>_>
       ::find(&this->m_messages,name);
  local_38._M_cur =
       (__node_type *)
       Catch::clara::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>_>_>
       ::end(&this->m_messages);
  bVar1 = Catch::clara::std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    ppVar2 = Catch::clara::std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_false,_true>
                           *)&local_30);
    (*(code *)**(undefined8 **)ppVar2->second)
              (__return_storage_ptr__,ppVar2->second,
               found_message.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::message_base_*>,_true>
               ._M_cur,0xffffffff);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    Catch::clara::std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>::vector
              ((vector<c74::min::atom,_std::allocator<c74::min::atom>_> *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

atoms object_base::try_call(const std::string& name, const atoms& args)
{
    auto found_message = m_messages.find(name);
    if (found_message != m_messages.end()) {
        return (*found_message->second)(args);
    }
    return {};
}